

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

wchar_t sg_append_buffer(sg_buffer buf_id,sg_range *data)

{
  wchar_t *pwVar1;
  GLuint buffer;
  wchar_t wVar2;
  GLenum target;
  int iVar3;
  _sg_buffer_t *p_Var4;
  long lVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  undefined4 in_register_0000003c;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x40b6,"int sg_append_buffer(sg_buffer, const sg_range *)");
  }
  if ((data == (sg_range *)0x0) || (data->ptr == (void *)0x0)) {
    __assert_fail("data && data->ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x40b7,"int sg_append_buffer(sg_buffer, const sg_range *)");
  }
  p_Var4 = _sg_lookup_buffer((_sg_pools_t *)CONCAT44(in_register_0000003c,buf_id.id),(uint32_t)data)
  ;
  if (p_Var4 == (_sg_buffer_t *)0x0) {
    wVar7 = L'\0';
  }
  else {
    if ((p_Var4->cmn).append_frame_index == _sg.frame_index) {
      wVar7 = (p_Var4->cmn).append_pos;
    }
    else {
      (p_Var4->cmn).append_pos = L'\0';
      (p_Var4->cmn).append_overflow = false;
      wVar7 = L'\0';
    }
    if ((p_Var4->cmn).size < ((int)data->size + 3U & 0xfffffffc) + wVar7) {
      (p_Var4->cmn).append_overflow = true;
    }
    if ((p_Var4->slot).state == SG_RESOURCESTATE_VALID) {
      if (_sg.desc.disable_validation == false) {
        if (data->ptr == (void *)0x0) {
          __assert_fail("buf && data && data->ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x3ae6,
                        "_Bool _sg_validate_append_buffer(const _sg_buffer_t *, const sg_range *)");
        }
        _sg.validate_error = _SG_VALIDATE_SUCCESS;
        _sg_validate((p_Var4->cmn).usage != SG_USAGE_IMMUTABLE,_SG_VALIDATE_APPENDBUF_USAGE);
        _sg_validate((p_Var4->cmn).append_pos + (int)data->size <= (p_Var4->cmn).size,
                     _SG_VALIDATE_APPENDBUF_SIZE);
        _sg_validate((p_Var4->cmn).update_frame_index != _sg.frame_index,
                     _SG_VALIDATE_APPENDBUF_UPDATE);
        _sg_validate_end();
      }
      if (((p_Var4->cmn).append_overflow == false) && (data->size != 0)) {
        if ((p_Var4->cmn).update_frame_index == _sg.frame_index) {
          __assert_fail("buf->cmn.update_frame_index != _sg.frame_index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x40c8,"int sg_append_buffer(sg_buffer, const sg_range *)");
        }
        if (data->ptr == (void *)0x0) {
          __assert_fail("buf && data && data->ptr && (data->size > 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f8b,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        if ((p_Var4->cmn).append_frame_index != _sg.frame_index) {
          wVar2 = (p_Var4->cmn).active_slot + L'\x01';
          wVar6 = L'\0';
          if (wVar2 < (p_Var4->cmn).num_slots) {
            wVar6 = wVar2;
          }
          (p_Var4->cmn).active_slot = wVar6;
        }
        target = _sg_gl_buffer_target((p_Var4->cmn).type);
        lVar5 = (long)(p_Var4->cmn).active_slot;
        if (1 < lVar5) {
          __assert_fail("buf->cmn.active_slot < SG_NUM_INFLIGHT_FRAMES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f92,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        buffer = (p_Var4->gl).buf[lVar5];
        if (buffer == 0) {
          __assert_fail("gl_buf",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f94,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        iVar3 = glGetError();
        if (iVar3 != 0) {
          __assert_fail("glGetError() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f95,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        if (target == 0x8892) {
          _sg.gl.cache.stored_vertex_buffer = _sg.gl.cache.vertex_buffer;
        }
        else {
          _sg.gl.cache.stored_index_buffer = _sg.gl.cache.index_buffer;
        }
        _sg_gl_cache_bind_buffer(target,buffer);
        glBufferSubData(target,(long)(p_Var4->cmn).append_pos,data->size,data->ptr);
        _sg_gl_cache_restore_buffer_binding(target);
        iVar3 = glGetError();
        if (iVar3 != 0) {
          __assert_fail("glGetError() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f9a,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        pwVar1 = &(p_Var4->cmn).append_pos;
        *pwVar1 = *pwVar1 + ((int)data->size + 3U & 0xfffffffc);
        (p_Var4->cmn).append_frame_index = _sg.frame_index;
      }
    }
  }
  return wVar7;
}

Assistant:

inline int sg_append_buffer(sg_buffer buf_id, const sg_range& data) { return sg_append_buffer(buf_id, &data); }